

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UgridReader.hpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
Parfait::UgridReader::readPyramids
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,string *filename,int begin,
          int end,bool swapBytes)

{
  pointer pcVar1;
  pointer piVar2;
  int *piVar3;
  int *piVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  FILE *__stream;
  long lVar9;
  domain_error *this;
  undefined4 in_register_00000014;
  int *piVar10;
  vector<int,_std::allocator<int>_> *__range1;
  size_type __n;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  allocator_type local_a5;
  int local_a4;
  int ntet;
  int nquad;
  int ntri;
  int nnodes;
  ulong local_90;
  undefined8 local_88;
  string local_80;
  int nhex;
  int nprism;
  int npyr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_88 = CONCAT44(in_register_00000014,begin);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + filename->_M_string_length);
  readHeader(&local_80,&nnodes,&ntri,&nquad,&ntet,&npyr,&nprism,&nhex,swapBytes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  iVar11 = (int)local_88;
  local_90 = (ulong)(uint)(end - iVar11);
  __n = (size_type)((end - iVar11) * 5);
  local_50._M_dataplus._M_p._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,__n,(value_type_conflict2 *)&local_50,&local_a5);
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  local_a4 = end;
  if (__stream != (FILE *)0x0) {
    fseek(__stream,((long)(iVar11 * 5) + (long)ntri * 4 + (long)nquad * 5 + (long)ntet * 4) * 4 +
                   (long)nnodes * 0x18 + 0x1c,0);
    fread((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start,4,__n,__stream);
    fclose(__stream);
    if (swapBytes && local_a4 != iVar11) {
      lVar9 = 0;
      do {
        piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar11 = piVar2[lVar9];
        auVar13._8_8_ = 0;
        auVar13._0_8_ =
             (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)iVar11 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)iVar11 >> 0x10),iVar11)) >>
                                                  0x20),iVar11) >> 0x18),
                                             CONCAT12((char)((uint)iVar11 >> 8),(short)iVar11)) >>
                                   0x10),(short)iVar11) & 0xffff00ff00ff00ff;
        auVar13 = pshuflw(auVar13,auVar13,0x1b);
        sVar5 = auVar13._0_2_;
        sVar6 = auVar13._2_2_;
        sVar7 = auVar13._4_2_;
        sVar8 = auVar13._6_2_;
        piVar2[lVar9] =
             CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar13[6] - (0xff < sVar8),
                      CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar13[4] - (0xff < sVar7),
                               CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar13[2] - (0xff < sVar6),
                                        (0 < sVar5) * (sVar5 < 0x100) * auVar13[0] - (0xff < sVar5))
                              ));
        lVar9 = lVar9 + 1;
      } while (__n + (__n == 0) != lVar9);
    }
    piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (piVar10 = piVar3; piVar10 != piVar4; piVar10 = piVar10 + 1) {
      *piVar10 = *piVar10 + -1;
    }
    if (0 < (int)local_90) {
      lVar9 = 0;
      do {
        auVar13 = *(undefined1 (*) [16])((long)piVar3 + lVar9 + 4);
        auVar12._0_8_ = auVar13._8_8_;
        auVar12._8_4_ = auVar13._0_4_;
        auVar12._12_4_ = auVar13._4_4_;
        *(undefined1 (*) [16])((long)piVar3 + lVar9 + 4) = auVar12;
        lVar9 = lVar9 + 0x14;
      } while ((local_90 & 0xffffffff) * 0x14 != lVar9);
    }
    return __return_storage_ptr__;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"Could not open .ugrid file: ",filename);
  std::domain_error::domain_error(this,(string *)&local_50);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

inline std::vector<int> Parfait::UgridReader::readPyramids(std::string filename,int begin,int end,bool swapBytes) {
    int nnodes,ntri,nquad,ntet,npyr,nprism,nhex;
    // get header info and allocate space for triangles
    readHeader(filename,nnodes,ntri,nquad,ntet,npyr,nprism,nhex,swapBytes);
    int nrequested = end - begin;
    std::vector<int> pyrs(5*nrequested,0);

    FILE *f = fopen(filename.c_str(),"rb");
    if(f == NULL){
        throw std::domain_error("Could not open .ugrid file: "+filename);
    }
    unsigned long int byteOffset = 7*sizeof(int) + 3*nnodes*sizeof(double);
    byteOffset += 3*ntri*sizeof(int);
    byteOffset += 4*nquad*sizeof(int);
    byteOffset += (ntri+nquad)*sizeof(int);
    byteOffset += 4*ntet*sizeof(int);
    byteOffset += 5*begin*sizeof(int);
    fseek(f,byteOffset,SEEK_SET);
    fread(&pyrs[0],sizeof(int),5*nrequested,f);
    fclose(f);
    if(swapBytes) {
        for (size_t i = 0; i < 5 * nrequested; i++) {
            bswap_32(&pyrs[i]);
        }
    }

    for(int& vertex : pyrs)
        vertex--;

    for(int i = 0; i < nrequested; i++)
        Parfait::AflrToCGNS::convertPyramid(&pyrs[5*i]);

    return pyrs;
}